

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# index_stats.cpp
# Opt level: O0

void __thiscall anon_unknown.dwarf_eff0::stats::stats(stats *this,database *db)

{
  database *db_local;
  stats *this_local;
  
  this->db_ = db;
  this->internal_out_edges_ = 0;
  this->internal_visited_ = 0;
  this->leaf_depth_ = 0;
  this->leaves_visited_ = 0;
  this->max_depth_ = 0;
  return;
}

Assistant:

stats::stats (database const & db) noexcept
            : db_{db} {}